

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::
GrowIntoSingleGroupShuffleTransferableSlots
          (HashSetResizeHelper *this,void *new_slots,size_t slot_size)

{
  ulong uVar1;
  size_t __n;
  
  if (*(ulong *)(this + 0x10) == 0) {
    __assert_fail("old_capacity_ > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x1e3,
                  "void absl::container_internal::HashSetResizeHelper::GrowIntoSingleGroupShuffleTransferableSlots(void *, size_t) const"
                 );
  }
  if (this[0x19] != (HashSetResizeHelper)0x1) {
    uVar1 = *(ulong *)(this + 0x10) >> 1;
    __n = (uVar1 + 1) * slot_size;
    memcpy(new_slots,(void *)(*(long *)(this + 8) + __n),uVar1 * slot_size);
    if (this[0x19] != (HashSetResizeHelper)0x1) {
      memcpy((void *)((long)new_slots + __n),*(void **)(this + 8),__n);
      return;
    }
  }
  __assert_fail("!was_soo_",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x7c2,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
}

Assistant:

void HashSetResizeHelper::GrowIntoSingleGroupShuffleTransferableSlots(
    void* new_slots, size_t slot_size) const {
  assert(old_capacity_ > 0);
  const size_t half_old_capacity = old_capacity_ / 2;

  SanitizerUnpoisonMemoryRegion(old_slots(), slot_size * old_capacity_);
  std::memcpy(new_slots,
              SlotAddress(old_slots(), half_old_capacity + 1, slot_size),
              slot_size * half_old_capacity);
  std::memcpy(SlotAddress(new_slots, half_old_capacity + 1, slot_size),
              old_slots(), slot_size * (half_old_capacity + 1));
}